

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::AreaLightSource
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  FileLoc *loc_00;
  ostream *poVar4;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  Float FVar5;
  string local_130;
  Float local_10c;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_108;
  long local_100;
  memory_resource local_f8 [2];
  ParameterDictionary local_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  local_108.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX,&local_108);
  ParameterDictionary::ParameterDictionary(&local_e8,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  local_100 = 0;
  local_f8[0]._vptr_memory_resource._0_1_ = 0;
  local_10c = 1.0;
  local_108.memoryResource = local_f8;
  if (this->upgrade == true) {
    bVar2 = upgradeRGBToScale(&local_e8,"scale",&local_10c);
    if (bVar2) {
      paVar1 = &local_130.field_2;
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"L","");
      FVar5 = ParameterDictionary::UpgradeBlackbody(&local_e8,&local_130);
      local_10c = FVar5 * local_10c;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      iVar3 = std::__cxx11::string::compare((char *)name);
      if (iVar3 == 0) {
        local_130._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_130,
                   (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
        Printf<std::__cxx11::string>("%sAreaLightSource \"diffuse\"\n",&local_130);
      }
      else {
        local_130._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_130,
                   (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
        Printf<std::__cxx11::string,std::__cxx11::string_const&>
                  ("%sAreaLightSource \"%s\"\n",&local_130,name);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"nsamples","");
      ParameterDictionary::RemoveInt(&local_e8,&local_130);
      goto LAB_00517b60;
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"scale","");
    loc_00 = ParameterDictionary::loc(&local_e8,&local_130);
    (this->super_SceneRepresentation).errorExit = true;
    Error(loc_00,
          "In pbrt-v4, \"scale\" is a \"float\" parameter to light sources. Please modify your scene file manually."
         );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_00517c2e;
  }
  else {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_130,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ("%sAreaLightSource \"%s\"\n",&local_130,name);
LAB_00517b60:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((local_10c != 1.0) || (NAN(local_10c))) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_130,
                 (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
      Printf<std::__cxx11::string,float&>("%s\"float scale\" [%f]\n",&local_130,&local_10c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_108.memoryResource,local_100);
    ParameterDictionary::ToParameterList_abi_cxx11_
              (&local_130,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,local_130._M_dataplus._M_p,local_130._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_00517c2e;
  }
  operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
LAB_00517c2e:
  if (local_108.memoryResource != local_f8) {
    operator_delete(local_108.memoryResource,
                    CONCAT71(local_f8[0]._vptr_memory_resource._1_7_,
                             local_f8[0]._vptr_memory_resource._0_1_) + 1);
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_e8.params);
  return;
}

Assistant:

void FormattingScene::AreaLightSource(const std::string &name,
                                      ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    std::string extra;
    Float totalScale = 1;
    if (upgrade) {
        if (!upgradeRGBToScale(&dict, "scale", &totalScale)) {
            ErrorExitDeferred(dict.loc("scale"),
                              "In pbrt-v4, \"scale\" is a \"float\" parameter "
                              "to light sources. "
                              "Please modify your scene file manually.");
            return;
        }

        totalScale *= dict.UpgradeBlackbody("L");

        if (name == "area")
            Printf("%sAreaLightSource \"diffuse\"\n", indent());
        else
            Printf("%sAreaLightSource \"%s\"\n", indent(), name);
        dict.RemoveInt("nsamples");
    } else
        Printf("%sAreaLightSource \"%s\"\n", indent(), name);

    if (totalScale != 1)
        Printf("%s\"float scale\" [%f]\n", indent(1), totalScale);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}